

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::OpenElement(XMLPrinter *this,char *name,bool compactMode)

{
  int iVar1;
  size_t sVar2;
  
  PrepareForNewNode(this,compactMode);
  DynArray<const_char_*,_10>::EnsureCapacity(&this->_stack,(this->_stack)._size + 1);
  iVar1 = (this->_stack)._size;
  (this->_stack)._mem[iVar1] = name;
  (this->_stack)._size = iVar1 + 1;
  (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xe])(this,"<",1);
  sVar2 = strlen(name);
  (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xe])(this,name,sVar2);
  this->_elementJustOpened = true;
  this->_depth = this->_depth + 1;
  return;
}

Assistant:

void XMLPrinter::OpenElement( const char* name, bool compactMode )
{
    PrepareForNewNode( compactMode );
    _stack.Push( name );

    Write ( "<" );
    Write ( name );

    _elementJustOpened = true;
    ++_depth;
}